

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

int xercesc_4_0::XMLDateTime::compareOrder(XMLDateTime *lValue,XMLDateTime *rValue)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  XMLDateTime lTemp;
  XMLDateTime rTemp;
  
  XMLDateTime(&lTemp,lValue);
  XMLDateTime(&rTemp,rValue);
  normalize(&lTemp);
  normalize(&rTemp);
  lVar3 = 2;
  while (iVar4 = -1, lVar3 != 10) {
    lVar1 = lVar3 + -2;
    lVar2 = lVar3 + -2;
    if ((lTemp.fValue[lVar1] < rTemp.fValue[lVar2]) ||
       (lVar3 = lVar3 + 1, iVar4 = 1, rTemp.fValue[lVar2] < lTemp.fValue[lVar1])) goto LAB_002626ca;
  }
  if ((lTemp.fHasTime != true) ||
     ((rTemp.fMilliSecond <= lTemp.fMilliSecond &&
      (iVar4 = 1, lTemp.fMilliSecond <= rTemp.fMilliSecond)))) {
    iVar4 = 0;
  }
LAB_002626ca:
  ~XMLDateTime(&rTemp);
  ~XMLDateTime(&lTemp);
  return iVar4;
}

Assistant:

int XMLDateTime::compareOrder(const XMLDateTime* const lValue
                            , const XMLDateTime* const rValue)
                            //, MemoryManager* const memMgr)
{
    //
    // If any of the them is not normalized() yet,
    // we need to do something here.
    //
    XMLDateTime lTemp = *lValue;
    XMLDateTime rTemp = *rValue;

    lTemp.normalize();
    rTemp.normalize();

    for ( int i = 0 ; i < TOTAL_SIZE; i++ )
    {
        if ( lTemp.fValue[i] < rTemp.fValue[i] )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fValue[i] > rTemp.fValue[i] )
        {
            return GREATER_THAN;
        }
    }

    if ( lTemp.fHasTime)
    {
        if ( lTemp.fMilliSecond < rTemp.fMilliSecond )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fMilliSecond > rTemp.fMilliSecond )
        {
            return GREATER_THAN;
        }
    }

    return EQUAL;
}